

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall AmpIO::ReadMotorSupplyVoltageBit(AmpIO *this,uint index)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t status;
  uint32_t dig_in;
  uint local_20;
  undefined1 local_1c [3];
  byte local_19;
  
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (7 < uVar2) {
    uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar2 == 0x514c4131) {
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      if ((pBVar1 != (BasePort *)0x0) &&
         (iVar3 = (*pBVar1->_vptr_BasePort[0x23])
                            (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,10,local_1c),
         (char)iVar3 != '\0')) {
        return (bool)((local_19 & 0x10) >> 4);
      }
    }
    else {
      uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
      if (1 < index - 1) {
        return false;
      }
      if (uVar2 != 0x44514c41) {
        return false;
      }
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      if (pBVar1 != (BasePort *)0x0) {
        iVar3 = (*pBVar1->_vptr_BasePort[0x23])
                          (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0,&local_20);
        if ((char)iVar3 == '\0') {
          return false;
        }
        return (local_20 & index << 4) != 0;
      }
    }
  }
  return false;
}

Assistant:

bool AmpIO::ReadMotorSupplyVoltageBit(unsigned int index) const
{
    bool ret = false;
    if (GetFirmwareVersion() < 8) return ret;

    if (GetHardwareVersion() == QLA1_String) {
        // Bit 28 in digital I/O register
        uint32_t dig_in;
        if (port && port->ReadQuadlet(BoardId, 0x0a, dig_in))
            ret = (dig_in&0x10000000);

    }
    else if ((GetHardwareVersion() == DQLA_String) && ((index == 1) || (index == 2))) {
        // Bits 5 (QLA2) and 4 (QLA1) in status register
        uint32_t status;
        if (port && port->ReadQuadlet(BoardId, BoardIO::BOARD_STATUS, status))
            ret = (status & (index << 4) );
    }
    return ret;
}